

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O1

void __thiscall Wasm::WasmBinaryReader::PrintOps(WasmBinaryReader *this)

{
  WasmOp WVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  uint uVar5;
  uint uVar6;
  HeapAllocator *this_00;
  undefined4 *puVar7;
  WasmOp *obj;
  EntryType *pEVar8;
  WasmFunctionInfo *pWVar9;
  ulong uVar10;
  uint uVar11;
  char16_t *pcVar12;
  uint uVar13;
  char16_t *pcVar14;
  size_t count;
  size_t byteSize;
  int iVar15;
  undefined1 local_60 [8];
  EntryIterator<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
  iter;
  
  uVar13 = (this->m_ops->
           super_BaseDictionary<Wasm::WasmOp,_Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
           ).count - (this->m_ops->
                     super_BaseDictionary<Wasm::WasmOp,_Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                     ).freeCount;
  if (uVar13 != 0) {
    count = (size_t)(int)uVar13;
    local_60 = (undefined1  [8])&WasmOp::typeinfo;
    iter.
    super_IteratorBase<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Wasm::WasmOp,_Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
    .entries = (EntryType *)0x0;
    iter.
    super_IteratorBase<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Wasm::WasmOp,_Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
    .dictionary = (BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                   *)anon_var_dwarf_af890c1;
    iter.
    super_IteratorBase<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Wasm::WasmOp,_Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
    .usedEntryCount = 0xb8;
    iter.
    super_IteratorBase<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Wasm::WasmOp,_Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
    ._8_8_ = count;
    this_00 = Memory::HeapAllocator::TrackAllocInfo
                        (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_60);
    byteSize = 0xffffffffffffffff;
    if (-1 < (int)uVar13) {
      byteSize = count * 2;
    }
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_00f2965d;
      *puVar7 = 0;
    }
    obj = (WasmOp *)Memory::HeapAllocator::AllocT<false>(this_00,byteSize);
    if (obj == (WasmOp *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) {
LAB_00f2965d:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
    }
    JsUtil::
    BaseDictionary<Wasm::WasmOp,_Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    ::
    EntryIterator<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
    ::EntryIterator((EntryIterator<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                     *)local_60,this->m_ops);
    bVar3 = JsUtil::
            BaseDictionary<Wasm::WasmOp,_Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            ::
            EntryIterator<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
            ::IsValid((EntryIterator<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                       *)local_60);
    if (bVar3) {
      iVar15 = 0;
      do {
        pEVar8 = JsUtil::
                 BaseDictionary<Wasm::WasmOp,_Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                 ::
                 IteratorBase<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Wasm::WasmOp,_Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
                 ::Current((IteratorBase<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Wasm::WasmOp,_Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
                            *)local_60);
        obj[iVar15] = (pEVar8->
                      super_DefaultHashedEntry<Wasm::WasmOp,_Wasm::WasmOp,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                      ).super_ImplicitKeyValueEntry<Wasm::WasmOp,_Wasm::WasmOp>.
                      super_ValueEntry<Wasm::WasmOp,_JsUtil::(anonymous_namespace)::ValueEntryData<Wasm::WasmOp>_>
                      .super_ValueEntryData<Wasm::WasmOp>.value;
        JsUtil::
        BaseDictionary<Wasm::WasmOp,_Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
        ::
        EntryIterator<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
        ::MoveNext((EntryIterator<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                    *)local_60);
        iVar15 = iVar15 + 1;
        bVar3 = JsUtil::
                BaseDictionary<Wasm::WasmOp,_Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                ::
                EntryIterator<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                ::IsValid((EntryIterator<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                           *)local_60);
      } while (bVar3);
    }
    if (0 < (int)uVar13) {
      uVar5 = 0;
      uVar10 = 1;
      do {
        iVar15 = (int)uVar10;
        if (uVar5 != 0) {
          do {
            uVar11 = (int)uVar10 - 1;
            uVar10 = (ulong)uVar11;
            WVar1 = obj[uVar10];
            if (obj[uVar10 - 1] <= WVar1) break;
            obj[uVar10] = obj[uVar10 - 1];
            obj[uVar10 - 1] = WVar1;
          } while (1 < (int)uVar11);
        }
        uVar5 = uVar5 + 1;
        uVar10 = (ulong)(iVar15 + 1);
      } while (uVar5 != uVar13);
    }
    pWVar9 = Js::WebAssemblyModule::GetWasmFunctionInfo(this->m_module,0);
    uVar6 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)(pWVar9->m_body).ptr);
    Output::Print(L"Module #%u\'s current opcode distribution\n",(ulong)uVar6);
    if (0 < (int)uVar13) {
      uVar10 = 0;
      do {
        WVar1 = obj[uVar10];
        if ((wbI32SatTruncS_F32|prefixThreads|wbNop) < WVar1) {
          switch(WVar1) {
          case wbV128Load:
            pcVar14 = L"V128Load";
            pcVar12 = L"v128.load";
            break;
          default:
            goto switchD_00f26e98_caseD_fd01;
          case wbV128Store:
            pcVar14 = L"V128Store";
            pcVar12 = L"v128.store";
            break;
          case wbV128Const:
            pcVar14 = L"V128Const";
            pcVar12 = L"v128.const";
            break;
          case wbV8X16Shuffle:
            pcVar14 = L"V8X16Shuffle";
            pcVar12 = L"i8x16.shuffle";
            break;
          case wbI16Splat:
            pcVar14 = L"I16Splat";
            pcVar12 = L"i8x16.splat";
            break;
          case wbI8Splat:
            pcVar14 = L"I8Splat";
            pcVar12 = L"i16x8.splat";
            break;
          case wbI4Splat:
            pcVar14 = L"I4Splat";
            pcVar12 = L"i32x4.splat";
            break;
          case wbI2Splat:
            pcVar14 = L"I2Splat";
            pcVar12 = L"i64x2.splat";
            break;
          case wbF4Splat:
            pcVar14 = L"F4Splat";
            pcVar12 = L"f32x4.splat";
            break;
          case wbF2Splat:
            pcVar14 = L"F2Splat";
            pcVar12 = L"f64x2.splat";
            break;
          case wbI16ExtractLaneS:
            pcVar14 = L"I16ExtractLaneS";
            pcVar12 = L"i8x16.extract_lane_s";
            break;
          case wbI16ExtractLaneU:
            pcVar14 = L"I16ExtractLaneU";
            pcVar12 = L"i8x16.extract_lane_u";
            break;
          case wbI16ReplaceLane:
            pcVar14 = L"I16ReplaceLane";
            pcVar12 = L"i8x16.replace_lane";
            break;
          case wbI8ExtractLaneS:
            pcVar14 = L"I8ExtractLaneS";
            pcVar12 = L"i16x8.extract_lane_s";
            break;
          case wbI8ExtractLaneU:
            pcVar14 = L"I8ExtractLaneU";
            pcVar12 = L"i16x8.extract_lane_u";
            break;
          case wbI8ReplaceLane:
            pcVar14 = L"I8ReplaceLane";
            pcVar12 = L"i16x8.replace_lane";
            break;
          case wbI4ExtractLane:
            pcVar14 = L"I4ExtractLane";
            pcVar12 = L"i32x4.extract_lane";
            break;
          case wbI4ReplaceLane:
            pcVar14 = L"I4ReplaceLane";
            pcVar12 = L"i32x4.replace_lane";
            break;
          case wbI2ExtractLane:
            pcVar14 = L"I2ExtractLane";
            pcVar12 = L"i64x2.extract_lane";
            break;
          case wbI2ReplaceLane:
            pcVar14 = L"I2ReplaceLane";
            pcVar12 = L"i64x2.replace_lane";
            break;
          case wbF4ExtractLane:
            pcVar14 = L"F4ExtractLane";
            pcVar12 = L"f32x4.extract_lane";
            break;
          case wbF4ReplaceLane:
            pcVar14 = L"F4ReplaceLane";
            pcVar12 = L"f32x4.replace_lane";
            break;
          case wbF2ExtractLane:
            pcVar14 = L"F2ExtractLane";
            pcVar12 = L"f64x2.extract_lane";
            break;
          case wbF2ReplaceLane:
            pcVar14 = L"F2ReplaceLane";
            pcVar12 = L"f64x2.replace_lane";
            break;
          case wbI16Eq:
            pcVar14 = L"I16Eq";
            pcVar12 = L"i8x16.eq";
            break;
          case wbI16Ne:
            pcVar14 = L"I16Ne";
            pcVar12 = L"i8x16.ne";
            break;
          case wbI16LtS:
            pcVar14 = L"I16LtS";
            pcVar12 = L"i8x16.lt_s";
            break;
          case wbI16LtU:
            pcVar14 = L"I16LtU";
            pcVar12 = L"i8x16.lt_u";
            break;
          case wbI16GtS:
            pcVar14 = L"I16GtS";
            pcVar12 = L"i8x16.gt_s";
            break;
          case wbI16GtU:
            pcVar14 = L"I16GtU";
            pcVar12 = L"i8x16.gt_u";
            break;
          case wbI16LeS:
            pcVar14 = L"I16LeS";
            pcVar12 = L"i8x16.le_s";
            break;
          case wbI16LeU:
            pcVar14 = L"I16LeU";
            pcVar12 = L"i8x16.le_u";
            break;
          case wbI16GeS:
            pcVar14 = L"I16GeS";
            pcVar12 = L"i8x16.ge_s";
            break;
          case wbI16GeU:
            pcVar14 = L"I16GeU";
            pcVar12 = L"i8x16.ge_u";
            break;
          case wbI8Eq:
            pcVar14 = L"I8Eq";
            pcVar12 = L"i16x8.eq";
            break;
          case wbI8Ne:
            pcVar14 = L"I8Ne";
            pcVar12 = L"i16x8.ne";
            break;
          case wbI8LtS:
            pcVar14 = L"I8LtS";
            pcVar12 = L"i16x8.lt_s";
            break;
          case wbI8LtU:
            pcVar14 = L"I8LtU";
            pcVar12 = L"i16x8.lt_u";
            break;
          case wbI8GtS:
            pcVar14 = L"I8GtS";
            pcVar12 = L"i16x8.gt_s";
            break;
          case wbI8GtU:
            pcVar14 = L"I8GtU";
            pcVar12 = L"i16x8.gt_u";
            break;
          case wbI8LeS:
            pcVar14 = L"I8LeS";
            pcVar12 = L"i16x8.le_s";
            break;
          case wbI8LeU:
            pcVar14 = L"I8LeU";
            pcVar12 = L"i16x8.le_u";
            break;
          case wbI8GeS:
            pcVar14 = L"I8GeS";
            pcVar12 = L"i16x8.ge_s";
            break;
          case wbI8GeU:
            pcVar14 = L"I8GeU";
            pcVar12 = L"i16x8.ge_u";
            break;
          case wbI4Eq:
            pcVar14 = L"I4Eq";
            pcVar12 = L"i32x4.eq";
            break;
          case wbI4Ne:
            pcVar14 = L"I4Ne";
            pcVar12 = L"i32x4.ne";
            break;
          case wbI4LtS:
            pcVar14 = L"I4LtS";
            pcVar12 = L"i32x4.lt_s";
            break;
          case wbI4LtU:
            pcVar14 = L"I4LtU";
            pcVar12 = L"i32x4.lt_u";
            break;
          case wbI4GtS:
            pcVar14 = L"I4GtS";
            pcVar12 = L"i32x4.gt_s";
            break;
          case wbI4GtU:
            pcVar14 = L"I4GtU";
            pcVar12 = L"i32x4.gt_u";
            break;
          case wbI4LeS:
            pcVar14 = L"I4LeS";
            pcVar12 = L"i32x4.le_s";
            break;
          case wbI4LeU:
            pcVar14 = L"I4LeU";
            pcVar12 = L"i32x4.le_u";
            break;
          case wbI4GeS:
            pcVar14 = L"I4GeS";
            pcVar12 = L"i32x4.ge_s";
            break;
          case wbI4GeU:
            pcVar14 = L"I4GeU";
            pcVar12 = L"i32x4.ge_u";
            break;
          case wbF4Eq:
            pcVar14 = L"F4Eq";
            pcVar12 = L"f32x4.eq";
            break;
          case wbF4Ne:
            pcVar14 = L"F4Ne";
            pcVar12 = L"f32x4.ne";
            break;
          case wbF4Lt:
            pcVar14 = L"F4Lt";
            pcVar12 = L"f32x4.lt";
            break;
          case wbF4Gt:
            pcVar14 = L"F4Gt";
            pcVar12 = L"f32x4.gt";
            break;
          case wbF4Le:
            pcVar14 = L"F4Le";
            pcVar12 = L"f32x4.le";
            break;
          case wbF4Ge:
            pcVar14 = L"F4Ge";
            pcVar12 = L"f32x4.ge";
            break;
          case wbF2Eq:
            pcVar14 = L"F2Eq";
            pcVar12 = L"f64x2.eq";
            break;
          case wbF2Ne:
            pcVar14 = L"F2Ne";
            pcVar12 = L"f64x2.ne";
            break;
          case wbF2Lt:
            pcVar14 = L"F2Lt";
            pcVar12 = L"f64x2.lt";
            break;
          case wbF2Gt:
            pcVar14 = L"F2Gt";
            pcVar12 = L"f64x2.gt";
            break;
          case wbF2Le:
            pcVar14 = L"F2Le";
            pcVar12 = L"f64x2.le";
            break;
          case wbF2Ge:
            pcVar14 = L"F2Ge";
            pcVar12 = L"f64x2.ge";
            break;
          case wbV128Not:
            pcVar14 = L"V128Not";
            pcVar12 = L"v128.not";
            break;
          case wbV128And:
            pcVar14 = L"V128And";
            pcVar12 = L"v128.and";
            break;
          case wbV128Or:
            pcVar14 = L"V128Or";
            pcVar12 = L"v128.or";
            break;
          case wbV128Xor:
            pcVar14 = L"V128Xor";
            pcVar12 = L"v128.xor";
            break;
          case wbV128Bitselect:
            pcVar14 = L"V128Bitselect";
            pcVar12 = L"v128.bitselect";
            break;
          case wbI16Neg:
            pcVar14 = L"I16Neg";
            pcVar12 = L"i8x16.neg";
            break;
          case wbI16AnyTrue:
            pcVar14 = L"I16AnyTrue";
            pcVar12 = L"i8x16.any_true";
            break;
          case wbI16AllTrue:
            pcVar14 = L"I16AllTrue";
            pcVar12 = L"i8x16.all_true";
            break;
          case wbI16Shl:
            pcVar14 = L"I16Shl";
            pcVar12 = L"i8x16.shl";
            break;
          case wbI16ShrS:
            pcVar14 = L"I16ShrS";
            pcVar12 = L"i8x16.shr_s";
            break;
          case wbI16ShrU:
            pcVar14 = L"I16ShrU";
            pcVar12 = L"i8x16.shr_u";
            break;
          case wbI16Add:
            pcVar14 = L"I16Add";
            pcVar12 = L"i8x16.add";
            break;
          case wbI16AddSaturateS:
            pcVar14 = L"I16AddSaturateS";
            pcVar12 = L"i8x16.add_sat_s";
            break;
          case wbI16AddSaturateU:
            pcVar14 = L"I16AddSaturateU";
            pcVar12 = L"i8x16.add_sat_u";
            break;
          case wbI16Sub:
            pcVar14 = L"I16Sub";
            pcVar12 = L"i8x16.sub";
            break;
          case wbI16SubSaturateS:
            pcVar14 = L"I16SubSaturateS";
            pcVar12 = L"i8x16.sub_sat_s";
            break;
          case wbI16SubSaturateU:
            pcVar14 = L"I16SubSaturateU";
            pcVar12 = L"i8x16.sub_sat_u";
            break;
          case wbI8Neg:
            pcVar14 = L"I8Neg";
            pcVar12 = L"i16x8.neg";
            break;
          case wbI8AnyTrue:
            pcVar14 = L"I8AnyTrue";
            pcVar12 = L"i16x8.any_true";
            break;
          case wbI8AllTrue:
            pcVar14 = L"I8AllTrue";
            pcVar12 = L"i16x8.all_true";
            break;
          case wbI8Shl:
            pcVar14 = L"I8Shl";
            pcVar12 = L"i16x8.shl";
            break;
          case wbI8ShrS:
            pcVar14 = L"I8ShrS";
            pcVar12 = L"i16x8.shr_s";
            break;
          case wbI8ShrU:
            pcVar14 = L"I8ShrU";
            pcVar12 = L"i16x8.shr_u";
            break;
          case wbI8Add:
            pcVar14 = L"I8Add";
            pcVar12 = L"i16x8.add";
            break;
          case wbI8AddSaturateS:
            pcVar14 = L"I8AddSaturateS";
            pcVar12 = L"i16x8.add_sat_s";
            break;
          case wbI8AddSaturateU:
            pcVar14 = L"I8AddSaturateU";
            pcVar12 = L"i16x8.add_sat_u";
            break;
          case wbI8Sub:
            pcVar14 = L"I8Sub";
            pcVar12 = L"i16x8.sub";
            break;
          case wbI8SubSaturateS:
            pcVar14 = L"I8SubSaturateS";
            pcVar12 = L"i16x8.sub_sat_s";
            break;
          case wbI8SubSaturateU:
            pcVar14 = L"I8SubSaturateU";
            pcVar12 = L"i16x8.sub_sat_u";
            break;
          case wbI8Mul:
            pcVar14 = L"I8Mul";
            pcVar12 = L"i16x8.mul";
            break;
          case wbI4Neg:
            pcVar14 = L"I4Neg";
            pcVar12 = L"i32x4.neg";
            break;
          case wbI4AnyTrue:
            pcVar14 = L"I4AnyTrue";
            pcVar12 = L"i32x4.any_true";
            break;
          case wbI4AllTrue:
            pcVar14 = L"I4AllTrue";
            pcVar12 = L"i32x4.all_true";
            break;
          case wbI4Shl:
            pcVar14 = L"I4Shl";
            pcVar12 = L"i32x4.shl";
            break;
          case wbI4ShrS:
            pcVar14 = L"I4ShrS";
            pcVar12 = L"i32x4.shr_s";
            break;
          case wbI4ShrU:
            pcVar14 = L"I4ShrU";
            pcVar12 = L"i32x4.shr_u";
            break;
          case wbI4Add:
            pcVar14 = L"I4Add";
            pcVar12 = L"i32x4.add";
            break;
          case wbI4Sub:
            pcVar14 = L"I4Sub";
            pcVar12 = L"i32x4.sub";
            break;
          case wbI4Mul:
            pcVar14 = L"I4Mul";
            pcVar12 = L"i32x4.mul";
            break;
          case wbI2Neg:
            pcVar14 = L"I2Neg";
            pcVar12 = L"i64x2.neg";
            break;
          case wbI2Shl:
            pcVar14 = L"I2Shl";
            pcVar12 = L"i64x2.shl";
            break;
          case wbI2ShrS:
            pcVar14 = L"I2ShrS";
            pcVar12 = L"i64x2.shr_s";
            break;
          case wbI2ShrU:
            pcVar14 = L"I2ShrU";
            pcVar12 = L"i64x2.shr_u";
            break;
          case wbI2Add:
            pcVar14 = L"I2Add";
            pcVar12 = L"i64x2.add";
            break;
          case wbI2Sub:
            pcVar14 = L"I2Sub";
            pcVar12 = L"i64x2.sub";
            break;
          case wbF4Abs:
            pcVar14 = L"F4Abs";
            pcVar12 = L"f32x4.abs";
            break;
          case wbF4Neg:
            pcVar14 = L"F4Neg";
            pcVar12 = L"f32x4.neg";
            break;
          case wbF4Sqrt:
            pcVar14 = L"F4Sqrt";
            pcVar12 = L"f32x4.sqrt";
            break;
          case wbF4Add:
            pcVar14 = L"F4Add";
            pcVar12 = L"f32x4.add";
            break;
          case wbF4Sub:
            pcVar14 = L"F4Sub";
            pcVar12 = L"f32x4.sub";
            break;
          case wbF4Mul:
            pcVar14 = L"F4Mul";
            pcVar12 = L"f32x4.mul";
            break;
          case wbF4Div:
            pcVar14 = L"F4Div";
            pcVar12 = L"f32x4.div";
            break;
          case wbF4Min:
            pcVar14 = L"F4Min";
            pcVar12 = L"f32x4.min";
            break;
          case wbF4Max:
            pcVar14 = L"F4Max";
            pcVar12 = L"f32x4.max";
            break;
          case wbF2Abs:
            pcVar14 = L"F2Abs";
            pcVar12 = L"f64x2.abs";
            break;
          case wbF2Neg:
            pcVar14 = L"F2Neg";
            pcVar12 = L"f64x2.neg";
            break;
          case wbF2Sqrt:
            pcVar14 = L"F2Sqrt";
            pcVar12 = L"f64x2.sqrt";
            break;
          case wbF2Add:
            pcVar14 = L"F2Add";
            pcVar12 = L"f64x2.add";
            break;
          case wbF2Sub:
            pcVar14 = L"F2Sub";
            pcVar12 = L"f64x2.sub";
            break;
          case wbF2Mul:
            pcVar14 = L"F2Mul";
            pcVar12 = L"f64x2.mul";
            break;
          case wbF2Div:
            pcVar14 = L"F2Div";
            pcVar12 = L"f64x2.div";
            break;
          case wbF2Min:
            pcVar14 = L"F2Min";
            pcVar12 = L"f64x2.min";
            break;
          case wbF2Max:
            pcVar14 = L"F2Max";
            pcVar12 = L"f64x2.max";
            break;
          case wbI4TruncS:
            pcVar14 = L"I4TruncS";
            pcVar12 = L"i32x4.trunc_sat_f32x4_s";
            break;
          case wbI4TruncU:
            pcVar14 = L"I4TruncU";
            pcVar12 = L"i32x4.trunc_sat_f32x4_u";
            break;
          case wbF4ConvertS:
            pcVar14 = L"F4ConvertS";
            pcVar12 = L"f32x4.convert_i32x4_s";
            break;
          case wbF4ConvertU:
            pcVar14 = L"F4ConvertU";
            pcVar12 = L"f32x4.convert_i32x4_u";
            break;
          case wbI32AtomicLoad:
            pcVar14 = L"I32AtomicLoad";
            pcVar12 = L"i32.atomic.load";
            break;
          case wbI64AtomicLoad:
            pcVar14 = L"I64AtomicLoad";
            pcVar12 = L"i64.atomic.load";
            break;
          case wbI32AtomicLoad8U:
            pcVar14 = L"I32AtomicLoad8U";
            pcVar12 = L"i32.atomic.load8_u";
            break;
          case wbI32AtomicLoad16U:
            pcVar14 = L"I32AtomicLoad16U";
            pcVar12 = L"i32.atomic.load16_u";
            break;
          case wbI64AtomicLoad8U:
            pcVar14 = L"I64AtomicLoad8U";
            pcVar12 = L"i64.atomic.load8_u";
            break;
          case wbI64AtomicLoad16U:
            pcVar14 = L"I64AtomicLoad16U";
            pcVar12 = L"i64.atomic.load16_u";
            break;
          case wbI64AtomicLoad32U:
            pcVar14 = L"I64AtomicLoad32U";
            pcVar12 = L"i64.atomic.load32_u";
            break;
          case wbI32AtomicStore:
            pcVar14 = L"I32AtomicStore";
            pcVar12 = L"i32.atomic.store";
            break;
          case wbI64AtomicStore:
            pcVar14 = L"I64AtomicStore";
            pcVar12 = L"i64.atomic.store";
            break;
          case wbI32AtomicStore8:
            pcVar14 = L"I32AtomicStore8";
            pcVar12 = L"i32.atomic.store8";
            break;
          case wbI32AtomicStore16:
            pcVar14 = L"I32AtomicStore16";
            pcVar12 = L"i32.atomic.store16";
            break;
          case wbI64AtomicStore8:
            pcVar14 = L"I64AtomicStore8";
            pcVar12 = L"i64.atomic.store8";
            break;
          case wbI64AtomicStore16:
            pcVar14 = L"I64AtomicStore16";
            pcVar12 = L"i64.atomic.store16";
            break;
          case wbI64AtomicStore32:
            pcVar14 = L"I64AtomicStore32";
            pcVar12 = L"i64.atomic.store32";
            break;
          case wbI32AtomicRmwAdd:
            pcVar14 = L"I32AtomicRmwAdd";
            pcVar12 = L"i32.atomic.rmw.add";
            break;
          case wbI64AtomicRmwAdd:
            pcVar14 = L"I64AtomicRmwAdd";
            pcVar12 = L"i64.atomic.rmw.add";
            break;
          case wbI32AtomicRmw8UAdd:
            pcVar14 = L"I32AtomicRmw8UAdd";
            pcVar12 = L"i32.atomic.rmw8_u.add";
            break;
          case wbI32AtomicRmw16UAdd:
            pcVar14 = L"I32AtomicRmw16UAdd";
            pcVar12 = L"i32.atomic.rmw16_u.add";
            break;
          case wbI64AtomicRmw8UAdd:
            pcVar14 = L"I64AtomicRmw8UAdd";
            pcVar12 = L"i64.atomic.rmw8_u.add";
            break;
          case wbI64AtomicRmw16UAdd:
            pcVar14 = L"I64AtomicRmw16UAdd";
            pcVar12 = L"i64.atomic.rmw16_u.add";
            break;
          case wbI64AtomicRmw32UAdd:
            pcVar14 = L"I64AtomicRmw32UAdd";
            pcVar12 = L"i64.atomic.rmw32_u.add";
            break;
          case wbI32AtomicRmwSub:
            pcVar14 = L"I32AtomicRmwSub";
            pcVar12 = L"i32.atomic.rmw.sub";
            break;
          case wbI64AtomicRmwSub:
            pcVar14 = L"I64AtomicRmwSub";
            pcVar12 = L"i64.atomic.rmw.sub";
            break;
          case wbI32AtomicRmw8USub:
            pcVar14 = L"I32AtomicRmw8USub";
            pcVar12 = L"i32.atomic.rmw8_u.sub";
            break;
          case wbI32AtomicRmw16USub:
            pcVar14 = L"I32AtomicRmw16USub";
            pcVar12 = L"i32.atomic.rmw16_u.sub";
            break;
          case wbI64AtomicRmw8USub:
            pcVar14 = L"I64AtomicRmw8USub";
            pcVar12 = L"i64.atomic.rmw8_u.sub";
            break;
          case wbI64AtomicRmw16USub:
            pcVar14 = L"I64AtomicRmw16USub";
            pcVar12 = L"i64.atomic.rmw16_u.sub";
            break;
          case wbI64AtomicRmw32USub:
            pcVar14 = L"I64AtomicRmw32USub";
            pcVar12 = L"i64.atomic.rmw32_u.sub";
            break;
          case wbI32AtomicRmwAnd:
            pcVar14 = L"I32AtomicRmwAnd";
            pcVar12 = L"i32.atomic.rmw.and";
            break;
          case wbI64AtomicRmwAnd:
            pcVar14 = L"I64AtomicRmwAnd";
            pcVar12 = L"i64.atomic.rmw.and";
            break;
          case wbI32AtomicRmw8UAnd:
            pcVar14 = L"I32AtomicRmw8UAnd";
            pcVar12 = L"i32.atomic.rmw8_u.and";
            break;
          case wbI32AtomicRmw16UAnd:
            pcVar14 = L"I32AtomicRmw16UAnd";
            pcVar12 = L"i32.atomic.rmw16_u.and";
            break;
          case wbI64AtomicRmw8UAnd:
            pcVar14 = L"I64AtomicRmw8UAnd";
            pcVar12 = L"i64.atomic.rmw8_u.and";
            break;
          case wbI64AtomicRmw16UAnd:
            pcVar14 = L"I64AtomicRmw16UAnd";
            pcVar12 = L"i64.atomic.rmw16_u.and";
            break;
          case wbI64AtomicRmw32UAnd:
            pcVar14 = L"I64AtomicRmw32UAnd";
            pcVar12 = L"i64.atomic.rmw32_u.and";
            break;
          case wbI32AtomicRmwOr:
            pcVar14 = L"I32AtomicRmwOr";
            pcVar12 = L"i32.atomic.rmw.or";
            break;
          case wbI64AtomicRmwOr:
            pcVar14 = L"I64AtomicRmwOr";
            pcVar12 = L"i64.atomic.rmw.or";
            break;
          case wbI32AtomicRmw8UOr:
            pcVar14 = L"I32AtomicRmw8UOr";
            pcVar12 = L"i32.atomic.rmw8_u.or";
            break;
          case wbI32AtomicRmw16UOr:
            pcVar14 = L"I32AtomicRmw16UOr";
            pcVar12 = L"i32.atomic.rmw16_u.or";
            break;
          case wbI64AtomicRmw8UOr:
            pcVar14 = L"I64AtomicRmw8UOr";
            pcVar12 = L"i64.atomic.rmw8_u.or";
            break;
          case wbI64AtomicRmw16UOr:
            pcVar14 = L"I64AtomicRmw16UOr";
            pcVar12 = L"i64.atomic.rmw16_u.or";
            break;
          case wbI64AtomicRmw32UOr:
            pcVar14 = L"I64AtomicRmw32UOr";
            pcVar12 = L"i64.atomic.rmw32_u.or";
            break;
          case wbI32AtomicRmwXor:
            pcVar14 = L"I32AtomicRmwXor";
            pcVar12 = L"i32.atomic.rmw.xor";
            break;
          case wbI64AtomicRmwXor:
            pcVar14 = L"I64AtomicRmwXor";
            pcVar12 = L"i64.atomic.rmw.xor";
            break;
          case wbI32AtomicRmw8UXor:
            pcVar14 = L"I32AtomicRmw8UXor";
            pcVar12 = L"i32.atomic.rmw8_u.xor";
            break;
          case wbI32AtomicRmw16UXor:
            pcVar14 = L"I32AtomicRmw16UXor";
            pcVar12 = L"i32.atomic.rmw16_u.xor";
            break;
          case wbI64AtomicRmw8UXor:
            pcVar14 = L"I64AtomicRmw8UXor";
            pcVar12 = L"i64.atomic.rmw8_u.xor";
            break;
          case wbI64AtomicRmw16UXor:
            pcVar14 = L"I64AtomicRmw16UXor";
            pcVar12 = L"i64.atomic.rmw16_u.xor";
            break;
          case wbI64AtomicRmw32UXor:
            pcVar14 = L"I64AtomicRmw32UXor";
            pcVar12 = L"i64.atomic.rmw32_u.xor";
            break;
          case wbI32AtomicRmwXchg:
            pcVar14 = L"I32AtomicRmwXchg";
            pcVar12 = L"i32.atomic.rmw.xchg";
            break;
          case wbI64AtomicRmwXchg:
            pcVar14 = L"I64AtomicRmwXchg";
            pcVar12 = L"i64.atomic.rmw.xchg";
            break;
          case wbI32AtomicRmw8UXchg:
            pcVar14 = L"I32AtomicRmw8UXchg";
            pcVar12 = L"i32.atomic.rmw8_u.xchg";
            break;
          case wbI32AtomicRmw16UXchg:
            pcVar14 = L"I32AtomicRmw16UXchg";
            pcVar12 = L"i32.atomic.rmw16_u.xchg";
            break;
          case wbI64AtomicRmw8UXchg:
            pcVar14 = L"I64AtomicRmw8UXchg";
            pcVar12 = L"i64.atomic.rmw8_u.xchg";
            break;
          case wbI64AtomicRmw16UXchg:
            pcVar14 = L"I64AtomicRmw16UXchg";
            pcVar12 = L"i64.atomic.rmw16_u.xchg";
            break;
          case wbI64AtomicRmw32UXchg:
            pcVar14 = L"I64AtomicRmw32UXchg";
            pcVar12 = L"i64.atomic.rmw32_u.xchg";
            break;
          case wbI32AtomicRmwCmpxchg:
            pcVar14 = L"I32AtomicRmwCmpxchg";
            pcVar12 = L"i32.atomic.rmw.cmpxchg";
            break;
          case wbI64AtomicRmwCmpxchg:
            pcVar14 = L"I64AtomicRmwCmpxchg";
            pcVar12 = L"i64.atomic.rmw.cmpxchg";
            break;
          case wbI32AtomicRmw8UCmpxchg:
            pcVar14 = L"I32AtomicRmw8UCmpxchg";
            pcVar12 = L"i32.atomic.rmw8_u.cmpxchg";
            break;
          case wbI32AtomicRmw16UCmpxchg:
            pcVar14 = L"I32AtomicRmw16UCmpxchg";
            pcVar12 = L"i32.atomic.rmw16_u.cmpxchg";
            break;
          case wbI64AtomicRmw8UCmpxchg:
            pcVar14 = L"I64AtomicRmw8UCmpxchg";
            pcVar12 = L"i64.atomic.rmw8_u.cmpxchg";
            break;
          case wbI64AtomicRmw16UCmpxchg:
            pcVar14 = L"I64AtomicRmw16UCmpxchg";
            pcVar12 = L"i64.atomic.rmw16_u.cmpxchg";
            break;
          case wbI64AtomicRmw32UCmpxchg:
            pcVar14 = L"I64AtomicRmw32UCmpxchg";
            pcVar12 = L"i64.atomic.rmw32_u.cmpxchg";
          }
          goto LAB_00f26fcb;
        }
        switch(WVar1) {
        case wbUnreachable:
          pcVar14 = L"Unreachable";
          pcVar12 = L"unreachable";
          break;
        case wbNop:
          pcVar14 = L"Nop";
          pcVar12 = L"nop";
          break;
        case wbBlock:
          pcVar14 = L"Block";
          pcVar12 = L"block";
          break;
        case wbLoop:
          pcVar14 = L"Loop";
          pcVar12 = L"loop";
          break;
        case wbIf:
          pcVar14 = L"If";
          pcVar12 = L"if";
          break;
        case wbElse:
          pcVar14 = L"Else";
          pcVar12 = L"else";
          break;
        case wbIf|wbBlock:
        case wbIf|wbLoop:
        case 8:
        case 9:
        case 10:
        case wbCall|wbBlock:
        case wbCall|wbLoop:
        case wbCall|wbIf:
        case wbCall|wbElse:
        case wbCall|wbIf|wbBlock:
        case wbCall|wbIf|wbLoop:
        case 0x18:
        case 0x19:
        case wbCall|wbBr:
        case wbCall|wbBrIf:
        case wbCall|wbBrTable:
        case wbCall|wbReturn:
        case wbSetGlobal|wbNop:
        case wbSetGlobal|wbBlock:
        case wbSetGlobal|wbLoop:
          goto switchD_00f26e98_caseD_fd01;
        case wbEnd:
          pcVar14 = L"End";
          pcVar12 = L"end";
          break;
        case wbBr:
          pcVar14 = L"Br";
          pcVar12 = L"br";
          break;
        case wbBrIf:
          pcVar14 = L"BrIf";
          pcVar12 = L"br_if";
          break;
        case wbBrTable:
          pcVar14 = L"BrTable";
          pcVar12 = L"br_table";
          break;
        case wbReturn:
          pcVar14 = L"Return";
          pcVar12 = L"return";
          break;
        case wbCall:
          pcVar14 = L"Call";
          pcVar12 = L"call";
          break;
        case wbCallIndirect:
          pcVar14 = L"CallIndirect";
          pcVar12 = L"call_indirect";
          break;
        case wbDrop:
          pcVar14 = L"Drop";
          pcVar12 = L"drop";
          break;
        case wbSelect:
          pcVar14 = L"Select";
          pcVar12 = L"select";
          break;
        case wbGetLocal:
          pcVar14 = L"GetLocal";
          pcVar12 = L"get_local";
          break;
        case wbSetLocal:
          pcVar14 = L"SetLocal";
          pcVar12 = L"set_local";
          break;
        case wbTeeLocal:
          pcVar14 = L"TeeLocal";
          pcVar12 = L"tee_local";
          break;
        case wbGetGlobal:
          pcVar14 = L"GetGlobal";
          pcVar12 = L"get_global";
          break;
        case wbSetGlobal:
          pcVar14 = L"SetGlobal";
          pcVar12 = L"set_global";
          break;
        case wbI32LoadMem:
          pcVar14 = L"I32LoadMem";
          pcVar12 = L"i32.load";
          break;
        case wbI64LoadMem:
          pcVar14 = L"I64LoadMem";
          pcVar12 = L"i64.load";
          break;
        case wbF32LoadMem:
          pcVar14 = L"F32LoadMem";
          pcVar12 = L"f32.load";
          break;
        case wbF64LoadMem:
          pcVar14 = L"F64LoadMem";
          pcVar12 = L"f64.load";
          break;
        case wbI32LoadMem8S:
          pcVar14 = L"I32LoadMem8S";
          pcVar12 = L"i32.load8_s";
          break;
        case wbI32LoadMem8U:
          pcVar14 = L"I32LoadMem8U";
          pcVar12 = L"i32.load8_u";
          break;
        case wbI32LoadMem16S:
          pcVar14 = L"I32LoadMem16S";
          pcVar12 = L"i32.load16_s";
          break;
        case wbI32LoadMem16U:
          pcVar14 = L"I32LoadMem16U";
          pcVar12 = L"i32.load16_u";
          break;
        case wbI64LoadMem8S:
          pcVar14 = L"I64LoadMem8S";
          pcVar12 = L"i64.load8_s";
          break;
        case wbI64LoadMem8U:
          pcVar14 = L"I64LoadMem8U";
          pcVar12 = L"i64.load8_u";
          break;
        case wbI64LoadMem16S:
          pcVar14 = L"I64LoadMem16S";
          pcVar12 = L"i64.load16_s";
          break;
        case wbI64LoadMem16U:
          pcVar14 = L"I64LoadMem16U";
          pcVar12 = L"i64.load16_u";
          break;
        case wbI64LoadMem32S:
          pcVar14 = L"I64LoadMem32S";
          pcVar12 = L"i64.load32_s";
          break;
        case wbI64LoadMem32U:
          pcVar14 = L"I64LoadMem32U";
          pcVar12 = L"i64.load32_u";
          break;
        case wbI32StoreMem:
          pcVar14 = L"I32StoreMem";
          pcVar12 = L"i32.store";
          break;
        case wbI64StoreMem:
          pcVar14 = L"I64StoreMem";
          pcVar12 = L"i64.store";
          break;
        case wbF32StoreMem:
          pcVar14 = L"F32StoreMem";
          pcVar12 = L"f32.store";
          break;
        case wbF64StoreMem:
          pcVar14 = L"F64StoreMem";
          pcVar12 = L"f64.store";
          break;
        case wbI32StoreMem8:
          pcVar14 = L"I32StoreMem8";
          pcVar12 = L"i32.store8";
          break;
        case wbI32StoreMem16:
          pcVar14 = L"I32StoreMem16";
          pcVar12 = L"i32.store16";
          break;
        case wbI64StoreMem8:
          pcVar14 = L"I64StoreMem8";
          pcVar12 = L"i64.store8";
          break;
        case wbI64StoreMem16:
          pcVar14 = L"I64StoreMem16";
          pcVar12 = L"i64.store16";
          break;
        case wbI64StoreMem32:
          pcVar14 = L"I64StoreMem32";
          pcVar12 = L"i64.store32";
          break;
        case wbMemorySize:
          pcVar14 = L"MemorySize";
          pcVar12 = L"memory.size";
          break;
        case wbMemoryGrow:
          pcVar14 = L"MemoryGrow";
          pcVar12 = L"memory.grow";
          break;
        case wbI32Const:
          pcVar14 = L"I32Const";
          pcVar12 = L"i32.const";
          break;
        case wbI64Const:
          pcVar14 = L"I64Const";
          pcVar12 = L"i64.const";
          break;
        case wbF32Const:
          pcVar14 = L"F32Const";
          pcVar12 = L"f32.const";
          break;
        case wbF64Const:
          pcVar14 = L"F64Const";
          pcVar12 = L"f64.const";
          break;
        case wbI32Eqz:
          pcVar14 = L"I32Eqz";
          pcVar12 = L"i32.eqz";
          break;
        case wbI32Eq:
          pcVar14 = L"I32Eq";
          pcVar12 = L"i32.eq";
          break;
        case wbI32Ne:
          pcVar14 = L"I32Ne";
          pcVar12 = L"i32.ne";
          break;
        case wbI32LtS:
          pcVar14 = L"I32LtS";
          pcVar12 = L"i32.lt_s";
          break;
        case wbI32LtU:
          pcVar14 = L"I32LtU";
          pcVar12 = L"i32.lt_u";
          break;
        case wbI32GtS:
          pcVar14 = L"I32GtS";
          pcVar12 = L"i32.gt_s";
          break;
        case wbI32GtU:
          pcVar14 = L"I32GtU";
          pcVar12 = L"i32.gt_u";
          break;
        case wbI32LeS:
          pcVar14 = L"I32LeS";
          pcVar12 = L"i32.le_s";
          break;
        case wbI32LeU:
          pcVar14 = L"I32LeU";
          pcVar12 = L"i32.le_u";
          break;
        case wbI32GeS:
          pcVar14 = L"I32GeS";
          pcVar12 = L"i32.ge_s";
          break;
        case wbI32GeU:
          pcVar14 = L"I32GeU";
          pcVar12 = L"i32.ge_u";
          break;
        case wbI64Eqz:
          pcVar14 = L"I64Eqz";
          pcVar12 = L"i64.eqz";
          break;
        case wbI64Eq:
          pcVar14 = L"I64Eq";
          pcVar12 = L"i64.eq";
          break;
        case wbI64Ne:
          pcVar14 = L"I64Ne";
          pcVar12 = L"i64.ne";
          break;
        case wbI64LtS:
          pcVar14 = L"I64LtS";
          pcVar12 = L"i64.lt_s";
          break;
        case wbI64LtU:
          pcVar14 = L"I64LtU";
          pcVar12 = L"i64.lt_u";
          break;
        case wbI64GtS:
          pcVar14 = L"I64GtS";
          pcVar12 = L"i64.gt_s";
          break;
        case wbI64GtU:
          pcVar14 = L"I64GtU";
          pcVar12 = L"i64.gt_u";
          break;
        case wbI64LeS:
          pcVar14 = L"I64LeS";
          pcVar12 = L"i64.le_s";
          break;
        case wbI64LeU:
          pcVar14 = L"I64LeU";
          pcVar12 = L"i64.le_u";
          break;
        case wbI64GeS:
          pcVar14 = L"I64GeS";
          pcVar12 = L"i64.ge_s";
          break;
        case wbI64GeU:
          pcVar14 = L"I64GeU";
          pcVar12 = L"i64.ge_u";
          break;
        case wbF32Eq:
          pcVar14 = L"F32Eq";
          pcVar12 = L"f32.eq";
          break;
        case wbF32Ne:
          pcVar14 = L"F32Ne";
          pcVar12 = L"f32.ne";
          break;
        case wbF32Lt:
          pcVar14 = L"F32Lt";
          pcVar12 = L"f32.lt";
          break;
        case wbF32Gt:
          pcVar14 = L"F32Gt";
          pcVar12 = L"f32.gt";
          break;
        case wbF32Le:
          pcVar14 = L"F32Le";
          pcVar12 = L"f32.le";
          break;
        case wbF32Ge:
          pcVar14 = L"F32Ge";
          pcVar12 = L"f32.ge";
          break;
        case wbF64Eq:
          pcVar14 = L"F64Eq";
          pcVar12 = L"f64.eq";
          break;
        case wbF64Ne:
          pcVar14 = L"F64Ne";
          pcVar12 = L"f64.ne";
          break;
        case wbF64Lt:
          pcVar14 = L"F64Lt";
          pcVar12 = L"f64.lt";
          break;
        case wbF64Gt:
          pcVar14 = L"F64Gt";
          pcVar12 = L"f64.gt";
          break;
        case wbF64Le:
          pcVar14 = L"F64Le";
          pcVar12 = L"f64.le";
          break;
        case wbF64Ge:
          pcVar14 = L"F64Ge";
          pcVar12 = L"f64.ge";
          break;
        case wbI32Clz:
          pcVar14 = L"I32Clz";
          pcVar12 = L"i32.clz";
          break;
        case wbI32Ctz:
          pcVar14 = L"I32Ctz";
          pcVar12 = L"i32.ctz";
          break;
        case wbI32Popcnt:
          pcVar14 = L"I32Popcnt";
          pcVar12 = L"i32.popcnt";
          break;
        case wbI32Add:
          pcVar14 = L"I32Add";
          pcVar12 = L"i32.add";
          break;
        case wbI32Sub:
          pcVar14 = L"I32Sub";
          pcVar12 = L"i32.sub";
          break;
        case wbI32Mul:
          pcVar14 = L"I32Mul";
          pcVar12 = L"i32.mul";
          break;
        case wbI32DivS:
          pcVar14 = L"I32DivS";
          pcVar12 = L"i32.div_s";
          break;
        case wbI32DivU:
          pcVar14 = L"I32DivU";
          pcVar12 = L"i32.div_u";
          break;
        case wbI32RemS:
          pcVar14 = L"I32RemS";
          pcVar12 = L"i32.rem_s";
          break;
        case wbI32RemU:
          pcVar14 = L"I32RemU";
          pcVar12 = L"i32.rem_u";
          break;
        case wbI32And:
          pcVar14 = L"I32And";
          pcVar12 = L"i32.and";
          break;
        case wbI32Or:
          pcVar14 = L"I32Or";
          pcVar12 = L"i32.or";
          break;
        case wbI32Xor:
          pcVar14 = L"I32Xor";
          pcVar12 = L"i32.xor";
          break;
        case wbI32Shl:
          pcVar14 = L"I32Shl";
          pcVar12 = L"i32.shl";
          break;
        case wbI32ShrS:
          pcVar14 = L"I32ShrS";
          pcVar12 = L"i32.shr_s";
          break;
        case wbI32ShrU:
          pcVar14 = L"I32ShrU";
          pcVar12 = L"i32.shr_u";
          break;
        case wbI32Rol:
          pcVar14 = L"I32Rol";
          pcVar12 = L"i32.rotl";
          break;
        case wbI32Ror:
          pcVar14 = L"I32Ror";
          pcVar12 = L"i32.rotr";
          break;
        case wbI64Clz:
          pcVar14 = L"I64Clz";
          pcVar12 = L"i64.clz";
          break;
        case wbI64Ctz:
          pcVar14 = L"I64Ctz";
          pcVar12 = L"i64.ctz";
          break;
        case wbI64Popcnt:
          pcVar14 = L"I64Popcnt";
          pcVar12 = L"i64.popcnt";
          break;
        case wbI64Add:
          pcVar14 = L"I64Add";
          pcVar12 = L"i64.add";
          break;
        case wbI64Sub:
          pcVar14 = L"I64Sub";
          pcVar12 = L"i64.sub";
          break;
        case wbI64Mul:
          pcVar14 = L"I64Mul";
          pcVar12 = L"i64.mul";
          break;
        case wbI64DivS:
          pcVar14 = L"I64DivS";
          pcVar12 = L"i64.div_s";
          break;
        case wbI64DivU:
          pcVar14 = L"I64DivU";
          pcVar12 = L"i64.div_u";
          break;
        case wbI64RemS:
          pcVar14 = L"I64RemS";
          pcVar12 = L"i64.rem_s";
          break;
        case wbI64RemU:
          pcVar14 = L"I64RemU";
          pcVar12 = L"i64.rem_u";
          break;
        case wbI64And:
          pcVar14 = L"I64And";
          pcVar12 = L"i64.and";
          break;
        case wbI64Or:
          pcVar14 = L"I64Or";
          pcVar12 = L"i64.or";
          break;
        case wbI64Xor:
          pcVar14 = L"I64Xor";
          pcVar12 = L"i64.xor";
          break;
        case wbI64Shl:
          pcVar14 = L"I64Shl";
          pcVar12 = L"i64.shl";
          break;
        case wbI64ShrS:
          pcVar14 = L"I64ShrS";
          pcVar12 = L"i64.shr_s";
          break;
        case wbI64ShrU:
          pcVar14 = L"I64ShrU";
          pcVar12 = L"i64.shr_u";
          break;
        case wbI64Rol:
          pcVar14 = L"I64Rol";
          pcVar12 = L"i64.rotl";
          break;
        case wbI64Ror:
          pcVar14 = L"I64Ror";
          pcVar12 = L"i64.rotr";
          break;
        case wbF32Abs:
          pcVar14 = L"F32Abs";
          pcVar12 = L"f32.abs";
          break;
        case wbF32Neg:
          pcVar14 = L"F32Neg";
          pcVar12 = L"f32.neg";
          break;
        case wbF32Ceil:
          pcVar14 = L"F32Ceil";
          pcVar12 = L"f32.ceil";
          break;
        case wbF32Floor:
          pcVar14 = L"F32Floor";
          pcVar12 = L"f32.floor";
          break;
        case wbF32Trunc:
          pcVar14 = L"F32Trunc";
          pcVar12 = L"f32.trunc";
          break;
        case wbF32NearestInt:
          pcVar14 = L"F32NearestInt";
          pcVar12 = L"f32.nearest";
          break;
        case wbF32Sqrt:
          pcVar14 = L"F32Sqrt";
          pcVar12 = L"f32.sqrt";
          break;
        case wbF32Add:
          pcVar14 = L"F32Add";
          pcVar12 = L"f32.add";
          break;
        case wbF32Sub:
          pcVar14 = L"F32Sub";
          pcVar12 = L"f32.sub";
          break;
        case wbF32Mul:
          pcVar14 = L"F32Mul";
          pcVar12 = L"f32.mul";
          break;
        case wbF32Div:
          pcVar14 = L"F32Div";
          pcVar12 = L"f32.div";
          break;
        case wbF32Min:
          pcVar14 = L"F32Min";
          pcVar12 = L"f32.min";
          break;
        case wbF32Max:
          pcVar14 = L"F32Max";
          pcVar12 = L"f32.max";
          break;
        case wbF32CopySign:
          pcVar14 = L"F32CopySign";
          pcVar12 = L"f32.copysign";
          break;
        case wbF64Abs:
          pcVar14 = L"F64Abs";
          pcVar12 = L"f64.abs";
          break;
        case wbF64Neg:
          pcVar14 = L"F64Neg";
          pcVar12 = L"f64.neg";
          break;
        case wbF64Ceil:
          pcVar14 = L"F64Ceil";
          pcVar12 = L"f64.ceil";
          break;
        case wbF64Floor:
          pcVar14 = L"F64Floor";
          pcVar12 = L"f64.floor";
          break;
        case wbF64Trunc:
          pcVar14 = L"F64Trunc";
          pcVar12 = L"f64.trunc";
          break;
        case wbF64NearestInt:
          pcVar14 = L"F64NearestInt";
          pcVar12 = L"f64.nearest";
          break;
        case wbF64Sqrt:
          pcVar14 = L"F64Sqrt";
          pcVar12 = L"f64.sqrt";
          break;
        case wbF64Add:
          pcVar14 = L"F64Add";
          pcVar12 = L"f64.add";
          break;
        case wbF64Sub:
          pcVar14 = L"F64Sub";
          pcVar12 = L"f64.sub";
          break;
        case wbF64Mul:
          pcVar14 = L"F64Mul";
          pcVar12 = L"f64.mul";
          break;
        case wbF64Div:
          pcVar14 = L"F64Div";
          pcVar12 = L"f64.div";
          break;
        case wbF64Min:
          pcVar14 = L"F64Min";
          pcVar12 = L"f64.min";
          break;
        case wbF64Max:
          pcVar14 = L"F64Max";
          pcVar12 = L"f64.max";
          break;
        case wbF64CopySign:
          pcVar14 = L"F64CopySign";
          pcVar12 = L"f64.copysign";
          break;
        case wbI32Wrap_I64:
          pcVar14 = L"I32Wrap_I64";
          pcVar12 = L"i32.wrap/i64";
          break;
        case wbI32TruncS_F32:
          pcVar14 = L"I32TruncS_F32";
          pcVar12 = L"i32.trunc_s/f32";
          break;
        case wbI32TruncU_F32:
          pcVar14 = L"I32TruncU_F32";
          pcVar12 = L"i32.trunc_u/f32";
          break;
        case wbI32TruncS_F64:
          pcVar14 = L"I32TruncS_F64";
          pcVar12 = L"i32.trunc_s/f64";
          break;
        case wbI32TruncU_F64:
          pcVar14 = L"I32TruncU_F64";
          pcVar12 = L"i32.trunc_u/f64";
          break;
        case wbI64ExtendS_I32:
          pcVar14 = L"I64ExtendS_I32";
          pcVar12 = L"i64.extend_s/i32";
          break;
        case wbI64ExtendU_I32:
          pcVar14 = L"I64ExtendU_I32";
          pcVar12 = L"i64.extend_u/i32";
          break;
        case wbI64TruncS_F32:
          pcVar14 = L"I64TruncS_F32";
          pcVar12 = L"i64.trunc_s/f32";
          break;
        case wbI64TruncU_F32:
          pcVar14 = L"I64TruncU_F32";
          pcVar12 = L"i64.trunc_u/f32";
          break;
        case wbI64TruncS_F64:
          pcVar14 = L"I64TruncS_F64";
          pcVar12 = L"i64.trunc_s/f64";
          break;
        case wbI64TruncU_F64:
          pcVar14 = L"I64TruncU_F64";
          pcVar12 = L"i64.trunc_u/f64";
          break;
        case wbF32SConvertI32:
          pcVar14 = L"F32SConvertI32";
          pcVar12 = L"f32.convert_s/i32";
          break;
        case wbF32UConvertI32:
          pcVar14 = L"F32UConvertI32";
          pcVar12 = L"f32.convert_u/i32";
          break;
        case wbF32SConvertI64:
          pcVar14 = L"F32SConvertI64";
          pcVar12 = L"f32.convert_s/i64";
          break;
        case wbF32UConvertI64:
          pcVar14 = L"F32UConvertI64";
          pcVar12 = L"f32.convert_u/i64";
          break;
        case wbF32DemoteF64:
          pcVar14 = L"F32DemoteF64";
          pcVar12 = L"f32.demote/f64";
          break;
        case wbF64SConvertI32:
          pcVar14 = L"F64SConvertI32";
          pcVar12 = L"f64.convert_s/i32";
          break;
        case wbF64UConvertI32:
          pcVar14 = L"F64UConvertI32";
          pcVar12 = L"f64.convert_u/i32";
          break;
        case wbF64SConvertI64:
          pcVar14 = L"F64SConvertI64";
          pcVar12 = L"f64.convert_s/i64";
          break;
        case wbF64UConvertI64:
          pcVar14 = L"F64UConvertI64";
          pcVar12 = L"f64.convert_u/i64";
          break;
        case wbF64PromoteF32:
          pcVar14 = L"F64PromoteF32";
          pcVar12 = L"f64.promote/f32";
          break;
        case wbI32ReinterpretF32:
          pcVar14 = L"I32ReinterpretF32";
          pcVar12 = L"i32.reinterpret/f32";
          break;
        case wbI64ReinterpretF64:
          pcVar14 = L"I64ReinterpretF64";
          pcVar12 = L"i64.reinterpret/f64";
          break;
        case wbF32ReinterpretI32:
          pcVar14 = L"F32ReinterpretI32";
          pcVar12 = L"f32.reinterpret/i32";
          break;
        case wbF64ReinterpretI64:
          pcVar14 = L"F64ReinterpretI64";
          pcVar12 = L"f64.reinterpret/i64";
          break;
        case wbI32Extend8_s:
          pcVar14 = L"I32Extend8_s";
          pcVar12 = L"i32.extend8_s";
          break;
        case wbI32Extend16_s:
          pcVar14 = L"I32Extend16_s";
          pcVar12 = L"i32.extend16_s";
          break;
        case wbI64Extend8_s:
          pcVar14 = L"I64Extend8_s";
          pcVar12 = L"i64.extend8_s";
          break;
        case wbI64Extend16_s:
          pcVar14 = L"I64Extend16_s";
          pcVar12 = L"i64.extend16_s";
          break;
        case wbI64Extend32_s:
          pcVar14 = L"I64Extend32_s";
          pcVar12 = L"i64.extend32_s";
          break;
        default:
          switch(WVar1) {
          case wbPrintFuncName:
            pcVar14 = L"PrintFuncName";
            break;
          case wbPrintArgSeparator:
            pcVar14 = L"PrintArgSeparator";
            break;
          case wbPrintBeginCall:
            pcVar14 = L"PrintBeginCall";
            break;
          case wbPrintNewLine:
            pcVar14 = L"PrintNewLine";
            break;
          case wbPrintEndCall:
            pcVar14 = L"PrintEndCall";
            break;
          case wbPrintEndCall|wbNop:
          case wbPrintEndCall|wbBlock:
          case wbPrintEndCall|wbLoop:
          case 0xf008:
          case 0xf009:
          case 0xf00a:
          case wbPrintFuncName|wbEnd:
            goto switchD_00f26e98_caseD_fd01;
          case wbPrintI32:
            pcVar14 = L"PrintI32";
            break;
          case wbPrintI64:
            pcVar14 = L"PrintI64";
            break;
          case wbPrintF32:
            pcVar14 = L"PrintF32";
            break;
          case wbPrintF64:
            pcVar14 = L"PrintF64";
            break;
          default:
            switch(WVar1) {
            case wbI32SatTruncS_F32:
              pcVar14 = L"I32SatTruncS_F32";
              pcVar12 = L"i32.trunc_s:sat/f32";
              break;
            case wbI32SatTruncU_F32:
              pcVar14 = L"I32SatTruncU_F32";
              pcVar12 = L"i32.trunc_u:sat/f32";
              break;
            case wbI32SatTruncS_F64:
              pcVar14 = L"I32SatTruncS_F64";
              pcVar12 = L"i32.trunc_s:sat/f64";
              break;
            case wbI32SatTruncU_F64:
              pcVar14 = L"I32SatTruncU_F64";
              pcVar12 = L"i32.trunc_u:sat/f64";
              break;
            case wbI64SatTruncS_F32:
              pcVar14 = L"I64SatTruncS_F32";
              pcVar12 = L"i64.trunc_s:sat/f32";
              break;
            case wbI64SatTruncU_F32:
              pcVar14 = L"I64SatTruncU_F32";
              pcVar12 = L"i64.trunc_u:sat/f32";
              break;
            case wbI64SatTruncS_F64:
              pcVar14 = L"I64SatTruncS_F64";
              pcVar12 = L"i64.trunc_s:sat/f64";
              break;
            case wbI64SatTruncU_F64:
              pcVar14 = L"I64SatTruncU_F64";
              pcVar12 = L"i64.trunc_u:sat/f64";
              break;
            default:
              goto switchD_00f26e98_caseD_fd01;
            }
            goto LAB_00f26fcb;
          }
          pcVar12 = L"";
        }
LAB_00f26fcb:
        Output::Print(L"%s: %s\r\n",pcVar14,pcVar12);
switchD_00f26e98_caseD_fd01:
        uVar10 = uVar10 + 1;
      } while (uVar13 != uVar10);
    }
    Memory::DeleteArray<Memory::HeapAllocator,Wasm::WasmOp>
              (&Memory::HeapAllocator::Instance,count,obj);
  }
  return;
}

Assistant:

void WasmBinaryReader::PrintOps()
{
    int count = m_ops->Count();
    if (count == 0)
    {
        return;
    }
    WasmOp* ops = HeapNewArray(WasmOp, count);

    auto iter = m_ops->GetIterator();
    int i = 0;
    while (iter.IsValid())
    {
        __analysis_assume(i < count);
        ops[i] = iter.CurrentKey();
        iter.MoveNext();
        ++i;
    }
    for (i = 0; i < count; ++i)
    {
        int j = i;
        while (j > 0 && ops[j-1] > ops[j])
        {
            WasmOp tmp = ops[j];
            ops[j] = ops[j - 1];
            ops[j - 1] = tmp;

            --j;
        }
    }

    uint32 moduleId = m_module->GetWasmFunctionInfo(0)->GetBody()->GetSourceContextId();
    Output::Print(_u("Module #%u's current opcode distribution\n"), moduleId);
    for (i = 0; i < count; ++i)
    {
        switch (ops[i])
        {
#define WASM_OPCODE(opname, opcode, sig, imp, wat) \
    case opcode: \
        Output::Print(_u("%s: %s\r\n"), _u(#opname), _u(wat)); \
        break;
#include "WasmBinaryOpCodes.h"
        }
    }
    HeapDeleteArray(count, ops);
}